

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es3fRasterizationTests.cpp
# Opt level: O1

int __thiscall
deqp::gles3::Functional::anon_unknown_1::BaseLineCase::init(BaseLineCase *this,EVP_PKEY_CTX *ctx)

{
  vector<float,_std::allocator<float>_> *this_00;
  ostringstream *this_01;
  iterator iVar1;
  int iVar2;
  undefined4 extraout_var;
  NotSupportedError *this_02;
  float range [2];
  undefined8 local_1a8;
  undefined1 local_1a0 [16];
  TestLog local_190 [13];
  ios_base local_128 [264];
  
  if (this->m_primitiveWideness == PRIMITIVEWIDENESS_WIDE) {
    local_1a8 = 0;
    iVar2 = (*((this->super_BaseRenderingCase).super_TestCase.m_context)->m_renderCtx->
              _vptr_RenderContext[3])();
    (**(code **)(CONCAT44(extraout_var,iVar2) + 0x818))(0x846e,&local_1a8);
    local_1a0._0_8_ =
         ((this->super_BaseRenderingCase).super_TestCase.super_TestCase.super_TestNode.m_testCtx)->
         m_log;
    this_01 = (ostringstream *)(local_1a0 + 8);
    std::__cxx11::ostringstream::ostringstream(this_01);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)this_01,"ALIASED_LINE_WIDTH_RANGE = [",0x1c);
    std::ostream::_M_insert<double>((double)(float)local_1a8);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)this_01,", ",2);
    std::ostream::_M_insert<double>((double)local_1a8._4_4_);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)this_01,"]",1);
    tcu::MessageBuilder::operator<<
              ((MessageBuilder *)local_1a0,(EndMessageToken *)&tcu::TestLog::EndMessage);
    std::__cxx11::ostringstream::~ostringstream(this_01);
    std::ios_base::~ios_base(local_128);
    if (local_1a8._4_4_ <= 1.0) {
      this_02 = (NotSupportedError *)__cxa_allocate_exception(0x38);
      local_1a0._0_8_ = local_190;
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)local_1a0,"wide line support required","");
      tcu::NotSupportedError::NotSupportedError(this_02,(string *)local_1a0);
      __cxa_throw(this_02,&tcu::NotSupportedError::typeinfo,tcu::Exception::~Exception);
    }
    this_00 = &this->m_lineWidths;
    local_1a0._0_4_ = 5.0;
    iVar1._M_current =
         (this->m_lineWidths).super__Vector_base<float,_std::allocator<float>_>._M_impl.
         super__Vector_impl_data._M_finish;
    if (iVar1._M_current ==
        (this->m_lineWidths).super__Vector_base<float,_std::allocator<float>_>._M_impl.
        super__Vector_impl_data._M_end_of_storage) {
      std::vector<float,_std::allocator<float>_>::_M_realloc_insert<float>
                (this_00,iVar1,(float *)local_1a0);
    }
    else {
      *iVar1._M_current = 5.0;
      (this->m_lineWidths).super__Vector_base<float,_std::allocator<float>_>._M_impl.
      super__Vector_impl_data._M_finish = iVar1._M_current + 1;
    }
    local_1a0._0_4_ = 0x41200000;
    iVar1._M_current =
         (this->m_lineWidths).super__Vector_base<float,_std::allocator<float>_>._M_impl.
         super__Vector_impl_data._M_finish;
    if (iVar1._M_current ==
        (this->m_lineWidths).super__Vector_base<float,_std::allocator<float>_>._M_impl.
        super__Vector_impl_data._M_end_of_storage) {
      std::vector<float,_std::allocator<float>_>::_M_realloc_insert<float>
                (this_00,iVar1,(float *)local_1a0);
    }
    else {
      *iVar1._M_current = 10.0;
      (this->m_lineWidths).super__Vector_base<float,_std::allocator<float>_>._M_impl.
      super__Vector_impl_data._M_finish = iVar1._M_current + 1;
    }
    ctx = (EVP_PKEY_CTX *)
          (this->m_lineWidths).super__Vector_base<float,_std::allocator<float>_>._M_impl.
          super__Vector_impl_data._M_finish;
    if (ctx == (EVP_PKEY_CTX *)
               (this->m_lineWidths).super__Vector_base<float,_std::allocator<float>_>._M_impl.
               super__Vector_impl_data._M_end_of_storage) {
      std::vector<float,std::allocator<float>>::_M_realloc_insert<float_const&>
                ((vector<float,std::allocator<float>> *)this_00,(iterator)ctx,
                 (float *)((long)&local_1a8 + 4));
    }
    else {
      *(float *)ctx = local_1a8._4_4_;
      ctx = (EVP_PKEY_CTX *)((long)ctx + 4);
      (this->m_lineWidths).super__Vector_base<float,_std::allocator<float>_>._M_impl.
      super__Vector_impl_data._M_finish = (pointer)ctx;
    }
    this->m_maxLineWidth = local_1a8._4_4_;
  }
  else if (this->m_primitiveWideness == PRIMITIVEWIDENESS_NARROW) {
    ctx = (EVP_PKEY_CTX *)(long)this->m_iterationCount;
    local_1a0._0_4_ = 0x3f800000;
    std::vector<float,_std::allocator<float>_>::resize
              (&this->m_lineWidths,(size_type)ctx,(value_type_conflict2 *)local_1a0);
  }
  iVar2 = BaseRenderingCase::init(&this->super_BaseRenderingCase,ctx);
  return iVar2;
}

Assistant:

void BaseLineCase::init (void)
{
	// create line widths
	if (m_primitiveWideness == PRIMITIVEWIDENESS_NARROW)
	{
		m_lineWidths.resize(m_iterationCount, 1.0f);
	}
	else if (m_primitiveWideness == PRIMITIVEWIDENESS_WIDE)
	{
		float range[2] = { 0.0f, 0.0f };
		m_context.getRenderContext().getFunctions().getFloatv(GL_ALIASED_LINE_WIDTH_RANGE, range);

		m_testCtx.getLog() << tcu::TestLog::Message << "ALIASED_LINE_WIDTH_RANGE = [" << range[0] << ", " << range[1] << "]" << tcu::TestLog::EndMessage;

		// no wide line support
		if (range[1] <= 1.0f)
			throw tcu::NotSupportedError("wide line support required");

		// set hand picked sizes
		m_lineWidths.push_back(5.0f);
		m_lineWidths.push_back(10.0f);
		m_lineWidths.push_back(range[1]);
		DE_ASSERT((int)m_lineWidths.size() == m_iterationCount);

		m_maxLineWidth = range[1];
	}
	else
		DE_ASSERT(false);

	// init parent
	BaseRenderingCase::init();
}